

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O2

size_t linenoiseUtf8NextCharLen(char *buf,size_t buf_len,size_t pos,size_t *col_len)

{
  ulong uVar1;
  int iVar2;
  undefined8 in_RAX;
  size_t sVar3;
  unsigned_long cp_00;
  ulong uVar4;
  undefined8 uStack_38;
  int cp;
  
  uStack_38 = in_RAX;
  sVar3 = utf8BytesToCodePoint(buf + pos,buf_len - pos,&cp);
  cp_00 = (unsigned_long)cp;
  iVar2 = isCombiningChar(cp_00);
  if (iVar2 == 0) {
    if (col_len != (size_t *)0x0) {
      iVar2 = isWideChar(cp_00);
      *col_len = 2 - (ulong)(iVar2 == 0);
    }
    uVar1 = sVar3 + pos;
    do {
      uVar4 = uVar1;
      if (buf_len < uVar4 || buf_len - uVar4 == 0) break;
      sVar3 = utf8BytesToCodePoint(buf + uVar4,buf_len - uVar4,&cp);
      iVar2 = isCombiningChar((long)cp);
      uVar1 = sVar3 + uVar4;
    } while (iVar2 != 0);
    sVar3 = uVar4 - pos;
  }
  else {
    sVar3 = 0;
  }
  return sVar3;
}

Assistant:

size_t linenoiseUtf8NextCharLen(const char* buf, size_t buf_len, size_t pos, size_t *col_len) {
    size_t beg = pos;
    int cp;
    size_t len = utf8BytesToCodePoint(buf + pos, buf_len - pos, &cp);
    if (isCombiningChar(cp)) {
        /* NOTREACHED */
        return 0;
    }
    if (col_len != NULL) *col_len = isWideChar(cp) ? 2 : 1;
    pos += len;
    while (pos < buf_len) {
        len = utf8BytesToCodePoint(buf + pos, buf_len - pos, &cp);
        if (!isCombiningChar(cp)) return pos - beg;
        pos += len;
    }
    return pos - beg;
}